

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall
Options::Add<std::__cxx11::string>
          (Options *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var,
          char flag,string *long_flag,string *description,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_val,
          string *group)

{
  pointer *ppoVar1;
  pointer pcVar2;
  iterator __position;
  mapped_type *this_00;
  option op;
  string local_d0;
  string local_b0;
  string local_90;
  option local_70;
  _Bind<void_(Options::*(Options_*,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar2 = (long_flag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + long_flag->_M_string_length);
  pcVar2 = (description->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + description->_M_string_length);
  pcVar2 = (group->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + group->_M_string_length);
  add_entry<std::__cxx11::string&>(this,&local_70,flag,&local_d0,&local_90,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_70.has_arg = 1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (var,default_val);
  local_50._M_f = (offset_in_Options_to_subr)set<std::__cxx11::string>;
  local_50._8_8_ = 0;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_Options_*,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>_>
  .
  super__Head_base<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_data =
       (_Head_base<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        )(_Head_base<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          )var;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_Options_*,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>_>
  .super__Head_base<0UL,_Options_*,_false>._M_head_impl = this;
  this_00 = std::
            map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::operator[](&this->setters,&local_70.val);
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)this_00,&local_50);
  __position._M_current =
       (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<option,std::allocator<option>>::_M_realloc_insert<option_const&>
              ((vector<option,std::allocator<option>> *)&this->options,__position,&local_70);
  }
  else {
    (__position._M_current)->flag = local_70.flag;
    (__position._M_current)->val = local_70.val;
    *(undefined4 *)&(__position._M_current)->field_0x1c = local_70._28_4_;
    (__position._M_current)->name = local_70.name;
    *(ulong *)&(__position._M_current)->has_arg = CONCAT44(local_70._12_4_,local_70.has_arg);
    ppoVar1 = &(this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppoVar1 = *ppoVar1 + 1;
  }
  return;
}

Assistant:

inline void Options::Add(T& var, char flag, std::string long_flag, std::string description, T default_val, std::string group) {
    struct option op;
    this->add_entry<T&>(op, flag, long_flag, description, group, true);

    op.has_arg = required_argument;
    var = default_val;

    this->setters[op.val] = std::bind(&Options::set<T>, this, std::ref(var), std::placeholders::_1);
    this->options.push_back(op);
}